

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

bool __thiscall ON_wString::Insert(ON_wString *this,int index,wchar_t *wsz)

{
  ON_wStringHeader *pOVar1;
  ulong uVar2;
  size_t sVar3;
  wchar_t *__src;
  unsigned_long move_bytes;
  wchar_t *p;
  size_t new_length;
  size_t insert_count;
  size_t length;
  wchar_t *wsz_local;
  int index_local;
  ON_wString *this_local;
  
  if ((index < 0) || (wsz == (wchar_t *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    pOVar1 = Header(this);
    uVar2 = (ulong)pOVar1->string_length;
    if (uVar2 < (ulong)(long)index) {
      this_local._7_1_ = false;
    }
    else {
      sVar3 = wcslen(wsz);
      ReserveArray(this,uVar2 + sVar3);
      __src = this->m_s + index;
      memmove(__src + sVar3,__src,((uVar2 - (long)index) + 1) * 4);
      memmove(__src,wsz,sVar3 << 2);
      pOVar1 = Header(this);
      pOVar1->string_length = (int)(uVar2 + sVar3);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_wString::Insert(int index, const wchar_t* wsz)
{
  if ((index < 0) || (wsz == nullptr))
    return false;

  const auto length = size_t(Header()->string_length);
  if (index > length)
    return false;

  const auto insert_count = wcslen(wsz);

  const auto new_length = length + insert_count;
  ReserveArray(new_length);

  auto* p = m_s + index;
  const auto move_bytes = (length - index + 1) * sizeof(wchar_t);
  memmove(p + insert_count, p, move_bytes);
  memmove(p, wsz, insert_count * sizeof(wchar_t));

  Header()->string_length = int(new_length);

  return true;
}